

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

uint Gia_LutDelayTraceTCEdges(Gia_Man_t *p,int iObj,float tDelta)

{
  uint *puVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  float *pfVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_128 [32];
  float local_a8 [32];
  
  if (-1 < iObj) {
    uVar11 = iObj * 3 + 1;
    uVar9 = p->vTiming->nSize;
    if ((int)uVar11 < (int)uVar9) {
      pvVar4 = p->pLutLib;
      pfVar5 = p->vTiming->pArray;
      fVar2 = pfVar5[uVar11];
      if (pvVar4 == (void *)0x0) {
        uVar11 = p->vMapping->nSize;
        if (iObj < (int)uVar11) {
          piVar7 = p->vMapping->pArray;
          uVar16 = piVar7[(uint)iObj];
          if ((-1 < (int)uVar16) && (uVar16 < uVar11)) {
            puVar1 = (uint *)(piVar7 + uVar16);
            uVar11 = *puVar1;
            uVar14 = 0;
            uVar16 = uVar11;
            if ((int)uVar11 < 1) {
              uVar16 = 0;
            }
            if (0 < (int)uVar11) {
              uVar14 = 0;
              uVar15 = 0;
              do {
                uVar11 = puVar1[uVar15 + 1];
                if (((int)uVar11 < 0) ||
                   (uVar8 = uVar11 * 3,
                   uVar9 == uVar8 || SBORROW4(uVar9,uVar8) != (int)(uVar9 + uVar11 * -3) < 0))
                goto LAB_0022b3f7;
                uVar11 = 1 << ((byte)uVar15 & 0x1f);
                if (pfVar5[uVar8] + 1.0 + tDelta <= fVar2) {
                  uVar11 = 0;
                }
                uVar14 = uVar14 | uVar11;
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
            return uVar14;
          }
        }
      }
      else {
        pVVar6 = p->vMapping;
        uVar11 = pVVar6->nSize;
        if (*(int *)((long)pvVar4 + 0xc) == 0) {
          if (iObj < (int)uVar11) {
            piVar7 = pVVar6->pArray;
            lVar13 = (long)piVar7[(uint)iObj];
            if ((-1 < lVar13) && ((uint)piVar7[(uint)iObj] < uVar11)) {
              lVar12 = (long)piVar7[lVar13];
              if (lVar12 < 1) {
                return 0;
              }
              lVar10 = 0;
              uVar11 = 0;
              while ((iVar3 = piVar7[lVar13 + lVar10 + 1], -1 < iVar3 &&
                     (uVar16 = iVar3 * 3,
                     uVar9 != uVar16 && SBORROW4(uVar9,uVar16) == (int)(uVar9 + iVar3 * -3) < 0))) {
                uVar14 = 1 << ((byte)lVar10 & 0x1f);
                if (pfVar5[uVar16] + *(float *)((long)pvVar4 + lVar12 * 0x84 + 0x94) + tDelta <=
                    fVar2) {
                  uVar14 = 0;
                }
                uVar11 = uVar11 | uVar14;
                lVar10 = lVar10 + 1;
                if (lVar12 == lVar10) {
                  return uVar11;
                }
              }
              goto LAB_0022b3f7;
            }
          }
        }
        else if (iObj < (int)uVar11) {
          uVar9 = pVVar6->pArray[(uint)iObj];
          if ((-1 < (long)(int)uVar9) && (uVar9 < uVar11)) {
            iVar3 = pVVar6->pArray[(int)uVar9];
            Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
            uVar9 = p->vMapping->nSize;
            if (iObj < (int)uVar9) {
              piVar7 = p->vMapping->pArray;
              uVar11 = piVar7[(uint)iObj];
              if ((-1 < (long)(int)uVar11) && (uVar11 < uVar9)) {
                puVar1 = (uint *)(piVar7 + (int)uVar11);
                uVar9 = *puVar1;
                uVar11 = uVar9;
                if ((int)uVar9 < 1) {
                  uVar11 = 0;
                }
                if ((int)uVar9 < 1) {
                  return 0;
                }
                uVar9 = 0;
                uVar15 = 0;
                while( true ) {
                  uVar16 = puVar1[(long)local_128[uVar15] + 1];
                  if ((int)uVar16 < 0) break;
                  uVar8 = uVar16 * 3;
                  uVar14 = p->vTiming->nSize;
                  if (uVar14 == uVar8 || SBORROW4(uVar14,uVar8) != (int)(uVar14 + uVar16 * -3) < 0)
                  break;
                  uVar16 = 1 << ((byte)local_128[uVar15] & 0x1f);
                  if (p->vTiming->pArray[uVar8] +
                      *(float *)((long)pvVar4 + uVar15 * 4 + (long)iVar3 * 0x84 + 0x94) + tDelta <=
                      fVar2) {
                    uVar16 = 0;
                  }
                  uVar9 = uVar9 | uVar16;
                  uVar15 = uVar15 + 1;
                  if (uVar11 == uVar15) {
                    return uVar9;
                  }
                }
                goto LAB_0022b3f7;
              }
            }
          }
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
LAB_0022b3f7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

unsigned Gia_LutDelayTraceTCEdges( Gia_Man_t * p, int iObj, float tDelta )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    float tRequired, * pDelays;
    unsigned uResult = 0;
    int k, iFanin;
    tRequired = Gia_ObjTimeRequired( p, iObj );
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}